

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1b21075::PeerManagerImpl::InitializeNode
          (PeerManagerImpl *this,CNode *node,ServiceFlags our_services)

{
  long lVar1;
  iterator __pos;
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *this_00;
  key_type_conflict4 *in_RDI;
  long in_FS_OFFSET;
  PeerRef peer;
  NodeId nodeid;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock27;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock26;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  NetPermissionFlags in_stack_ffffffffffffff18;
  NetPermissionFlags in_stack_ffffffffffffff1c;
  map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  *in_stack_ffffffffffffff20;
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  *this_01;
  TxRequestTracker *in_stack_ffffffffffffff28;
  char *in_stack_ffffffffffffff40;
  map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  *this_02;
  char *in_stack_ffffffffffffff48;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffff50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  iterator this_03;
  const_iterator in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CNode::GetId((CNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  this_02 = (map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
             *)(in_RDI + 0x4e);
  std::
  map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
  ::end(in_stack_ffffffffffffff20);
  std::_Rb_tree_const_iterator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>::
  _Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(iterator *)0x10707a0);
  __pos = std::
          map<long,_(anonymous_namespace)::CNodeState,_std::less<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::CNodeState>_>_>
          ::try_emplace<>(this_02,in_stack_ffffffffffffff80,in_RDI);
  this_03 = __pos;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_03._M_node,in_stack_ffffffffffffff50,
             (char *)__pos._M_node,(char *)this_02,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  this_00 = (map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
             *)TxRequestTracker::Count(in_stack_ffffffffffffff28,(NodeId)in_stack_ffffffffffffff20);
  if (this_00 !=
      (map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
       *)0x0) {
    __assert_fail("m_txrequest.Count(nodeid) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
                  ,0x6bc,
                  "virtual void (anonymous namespace)::PeerManagerImpl::InitializeNode(const CNode &, ServiceFlags)"
                 );
  }
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  NetPermissions::HasFlag(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  CNode::IsInboundConn((CNode *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::make_shared<(anonymous_namespace)::Peer,long&,ServiceFlags&,bool>
            ((long *)this_03._M_node,(ServiceFlags *)in_stack_ffffffffffffff50,(bool *)__pos._M_node
            );
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)this_03._M_node,in_stack_ffffffffffffff50,
             (char *)__pos._M_node,(char *)this_02,(int)((ulong)in_RDI >> 0x20),
             SUB81((ulong)in_RDI >> 0x18,0));
  this_01 = (map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
             *)(in_RDI + 0x48);
  std::
  map<long,_std::shared_ptr<(anonymous_namespace)::Peer>,_std::less<long>,_std::allocator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>_>
  ::end(this_01);
  std::
  _Rb_tree_const_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>::
  _Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<std::pair<const_long,_std::shared_ptr<(anonymous_namespace)::Peer>_>_>
              *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(iterator *)0x1070971)
  ;
  std::
  map<long,std::shared_ptr<(anonymous_namespace)::Peer>,std::less<long>,std::allocator<std::pair<long_const,std::shared_ptr<(anonymous_namespace)::Peer>>>>
  ::emplace_hint<long&,std::shared_ptr<(anonymous_namespace)::Peer>&>
            (this_00,(const_iterator)__pos._M_node,(long *)in_stack_ffffffffffffff28,
             (shared_ptr<(anonymous_namespace)::Peer> *)this_01);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  std::shared_ptr<(anonymous_namespace)::Peer>::~shared_ptr
            ((shared_ptr<(anonymous_namespace)::Peer> *)
             CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PeerManagerImpl::InitializeNode(const CNode& node, ServiceFlags our_services)
{
    NodeId nodeid = node.GetId();
    {
        LOCK(cs_main); // For m_node_states
        m_node_states.try_emplace(m_node_states.end(), nodeid);
    }
    {
        LOCK(m_tx_download_mutex);
        assert(m_txrequest.Count(nodeid) == 0);
    }

    if (NetPermissions::HasFlag(node.m_permission_flags, NetPermissionFlags::BloomFilter)) {
        our_services = static_cast<ServiceFlags>(our_services | NODE_BLOOM);
    }

    PeerRef peer = std::make_shared<Peer>(nodeid, our_services, node.IsInboundConn());
    {
        LOCK(m_peer_mutex);
        m_peer_map.emplace_hint(m_peer_map.end(), nodeid, peer);
    }
}